

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O0

SparseMatrix * ipx::CopyColumns(SparseMatrix *A,vector<int,_std::allocator<int>_> *cols)

{
  bool bVar1;
  uint i;
  Int IVar2;
  char *pcVar3;
  int __c;
  SparseMatrix *in_RSI;
  SparseMatrix *in_RDI;
  Int p;
  Int j;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  SparseMatrix *A2;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint local_40;
  undefined8 in_stack_ffffffffffffffc8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffd0;
  
  SparseMatrix::rows(in_RSI);
  SparseMatrix::SparseMatrix
            ((SparseMatrix *)in_stack_ffffffffffffffd0._M_current,
             (Int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(Int)in_stack_ffffffffffffffc8);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffd0);
    i = SparseMatrix::begin((SparseMatrix *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            (Int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    local_40 = i;
    while (in_stack_ffffffffffffff94 = local_40,
          IVar2 = SparseMatrix::end((SparseMatrix *)CONCAT44(local_40,in_stack_ffffffffffffff90),
                                    (Int)((ulong)in_stack_ffffffffffffff88 >> 0x20)),
          (int)in_stack_ffffffffffffff94 < IVar2) {
      pcVar3 = SparseMatrix::index(in_RSI,(char *)(ulong)local_40,__c);
      in_stack_ffffffffffffff90 = SUB84(pcVar3,0);
      in_stack_ffffffffffffff88 =
           (vector<int,_std::allocator<int>_> *)
           SparseMatrix::value((SparseMatrix *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               (Int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      SparseMatrix::push_back
                (in_RDI,i,(double)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      local_40 = local_40 + 1;
    }
    SparseMatrix::add_column(in_RSI);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffd0);
  }
  return in_RDI;
}

Assistant:

SparseMatrix CopyColumns(const SparseMatrix& A, const std::vector<Int>& cols) {
    SparseMatrix A2(A.rows(), 0);
    for (Int j : cols) {
        for (Int p = A.begin(j); p < A.end(j); p++)
            A2.push_back(A.index(p), A.value(p));
        A2.add_column();
    }
    return A2;
}